

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_rollback_all(fdb_file_handle *fhandle,fdb_snapshot_marker_t marker)

{
  fdb_kvs_handle *handle_00;
  kvs_info *pkVar1;
  bool bVar2;
  _fdb_kvs_handle *this;
  undefined8 *in_RDI;
  fdb_seqnum_t old_seqnum;
  file_status_t fstatus;
  uint sleep_time;
  snap_handle shandle;
  kvs_info *kvs;
  err_log_callback log_callback;
  fdb_status fs;
  fdb_kvs_config kvs_config;
  filemgr *file;
  fdb_kvs_handle *handle;
  fdb_kvs_handle rhandle;
  fdb_kvs_handle *super_handle;
  fdb_config config;
  fdb_config *in_stack_00001800;
  fdb_filename_mode_t in_stack_0000180c;
  char *in_stack_00001810;
  fdb_kvs_handle *in_stack_00001818;
  err_log_callback *in_stack_fffffffffffffb78;
  filemgr *in_stack_fffffffffffffb80;
  filemgr *in_stack_fffffffffffffb88;
  _fdb_kvs_handle *in_stack_fffffffffffffb98;
  fdb_file_handle *in_stack_fffffffffffffba0;
  file_status_t local_455;
  undefined1 local_450 [39];
  undefined1 in_stack_fffffffffffffbd7;
  uint64_t in_stack_fffffffffffffbd8;
  uint64_t in_stack_fffffffffffffbe0;
  docio_handle *in_stack_fffffffffffffbe8;
  kvs_header *in_stack_fffffffffffffbf0;
  fdb_kvs_handle *in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc46;
  fdb_commit_opt_t in_stack_fffffffffffffc47;
  fdb_kvs_handle *in_stack_fffffffffffffc48;
  err_log_callback local_368;
  fdb_status local_34c;
  undefined8 local_348;
  fdb_custom_cmp_variable local_340;
  void *local_338;
  filemgr *local_330;
  undefined8 *local_328;
  undefined8 local_320;
  fdb_kvs_id_t in_stack_fffffffffffffce8;
  bid_t in_stack_fffffffffffffcf0;
  fdb_restore_mode_t in_stack_fffffffffffffcfc;
  fdb_kvs_handle *in_stack_fffffffffffffd00;
  undefined1 local_110 [256];
  undefined8 *local_10;
  fdb_status local_4;
  
  local_10 = in_RDI;
  _fdb_kvs_handle::_fdb_kvs_handle((_fdb_kvs_handle *)0x1560c4);
  local_328 = &local_320;
  err_log_callback::err_log_callback(&local_368);
  if (local_10 == (undefined8 *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    handle_00 = (fdb_kvs_handle *)*local_10;
    pkVar1 = handle_00->kvs;
    if ((pkVar1 == (kvs_info *)0x0) || (bVar2 = _fdb_kvs_is_busy(in_stack_fffffffffffffba0), !bVar2)
       ) {
      local_330 = handle_00->file;
      memcpy(local_110,&handle_00->config,0xf8);
      local_348 = *(undefined8 *)&handle_00->kvs_config;
      local_340 = (handle_00->kvs_config).custom_cmp;
      local_338 = (handle_00->kvs_config).custom_cmp_param;
      local_368.callback = (handle_00->log_callback).callback;
      local_368.callback_ex = (handle_00->log_callback).callback_ex;
      local_368.ctx_data = (handle_00->log_callback).ctx_data;
      if (((handle_00->config).flags & 2) == 0) {
        filemgr_mutex_lock((filemgr *)0x156269);
        filemgr_set_rollback
                  (in_stack_fffffffffffffb80,(uint8_t)((ulong)in_stack_fffffffffffffb78 >> 0x38));
        bVar2 = wal_txn_exists(in_stack_fffffffffffffb88);
        if (bVar2) {
          filemgr_set_rollback
                    (in_stack_fffffffffffffb80,(uint8_t)((ulong)in_stack_fffffffffffffb78 >> 0x38));
          filemgr_mutex_unlock((filemgr *)0x1562ba);
          local_4 = FDB_RESULT_FAIL_BY_TRANSACTION;
        }
        else {
          local_455 = filemgr_get_file_status((filemgr *)0x1562e3);
          while (local_455 == '\x01') {
            filemgr_mutex_unlock((filemgr *)0x156302);
            decaying_usleep((uint *)in_stack_fffffffffffffb80,
                            (uint)((ulong)in_stack_fffffffffffffb78 >> 0x20));
            filemgr_mutex_lock((filemgr *)0x156322);
            local_455 = filemgr_get_file_status((filemgr *)0x156333);
          }
          if (local_455 == '\x04') {
            filemgr_mutex_unlock((filemgr *)0x156354);
            fdb_check_file_reopen(handle_00,(file_status_t *)0x0);
          }
          else {
            filemgr_mutex_unlock((filemgr *)0x156378);
          }
          fdb_sync_db_header(in_stack_fffffffffffffc28);
          local_34c = wal_shutdown(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          local_4 = local_34c;
          if (local_34c == FDB_RESULT_SUCCESS) {
            memset(local_328,0,0x208);
            memset(local_450,0,0xe0);
            local_328[0x2d] = local_368.callback;
            local_328[0x2e] = local_368.callback_ex;
            local_328[0x2f] = local_368.ctx_data;
            local_328[5] = local_10;
            atomic_store_uint64_t
                      ((atomic<unsigned_long> *)in_stack_fffffffffffffb80,
                       (uint64_t)in_stack_fffffffffffffb78,memory_order_relaxed);
            local_328[0x37] = 0xffffffffffffffff;
            local_328[0x35] = local_450;
            if (pkVar1 != (kvs_info *)0x0) {
              fdb_kvs_header_free((filemgr *)0x156497);
              local_328[3] = pkVar1;
              *local_328 = local_348;
              local_328[1] = local_340;
              local_328[2] = local_338;
            }
            memcpy(local_328 + 0xe,local_110,0xf8);
            local_34c = _fdb_open(in_stack_00001818,in_stack_00001810,in_stack_0000180c,
                                  in_stack_00001800);
            if ((*(byte *)(local_328 + 0x16) & 1) != 0) {
              filemgr_mutex_lock((filemgr *)0x156542);
              fdb_kvs_header_create((filemgr *)0x156553);
              fdb_kvs_header_read(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                  in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                                  (bool)in_stack_fffffffffffffbd7);
              filemgr_mutex_unlock((filemgr *)0x1565ad);
            }
            filemgr_set_rollback
                      (in_stack_fffffffffffffb80,(uint8_t)((ulong)in_stack_fffffffffffffb78 >> 0x38)
                      );
            local_328[0x35] = 0;
            if (local_34c == FDB_RESULT_SUCCESS) {
              _fdb_restore_wal(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                               in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
              filemgr_mutex_lock((filemgr *)0x156605);
              this = (_fdb_kvs_handle *)filemgr_get_seqnum((filemgr *)0x156612);
              filemgr_set_seqnum(in_stack_fffffffffffffb80,(fdb_seqnum_t)in_stack_fffffffffffffb78);
              filemgr_mutex_unlock((filemgr *)0x156640);
              local_34c = _fdb_commit(in_stack_fffffffffffffc48,in_stack_fffffffffffffc47,
                                      (bool)in_stack_fffffffffffffc46);
              if (local_34c == FDB_RESULT_SUCCESS) {
                _fdb_close((fdb_kvs_handle *)in_stack_fffffffffffffb88);
                _fdb_kvs_handle::operator=(this,in_stack_fffffffffffffb98);
              }
              else {
                filemgr_mutex_lock((filemgr *)0x1566b3);
                filemgr_set_seqnum(in_stack_fffffffffffffb80,(fdb_seqnum_t)in_stack_fffffffffffffb78
                                  );
                filemgr_mutex_unlock((filemgr *)0x1566d2);
              }
            }
            else {
              fdb_kvs_header_create((filemgr *)0x1566e1);
              ver_get_latest_magic();
              fdb_kvs_header_read(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                  in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                                  (bool)in_stack_fffffffffffffbd7);
            }
            local_4 = local_34c;
          }
        }
      }
      else {
        local_4 = fdb_log_impl(&handle_00->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                               ,"fdb_rollback_all",0x55c,
                               "Warning: Rollback is not allowed on the read-only DB file \'%s\'.",
                               handle_00->file->filename);
      }
    }
    else {
      local_4 = FDB_RESULT_KV_STORE_BUSY;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_rollback_all(fdb_file_handle *fhandle,
                            fdb_snapshot_marker_t marker)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    fdb_kvs_handle *super_handle;
    fdb_kvs_handle rhandle;
    fdb_kvs_handle *handle = &rhandle;
    struct filemgr *file;
    fdb_kvs_config kvs_config;
    fdb_status fs;
    err_log_callback log_callback;
    struct kvs_info *kvs;
    struct snap_handle shandle; // dummy snap handle

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    super_handle = fhandle->root;
    kvs = super_handle->kvs;

    // fdb_rollback_all cannot be allowed when there are kv store instances
    // still open, because we do not have means of invalidating open kv handles
    // which may not be present in the rollback point
    if (kvs && _fdb_kvs_is_busy(fhandle)) {
        return FDB_RESULT_KV_STORE_BUSY;
    }
    file = super_handle->file;
    config = super_handle->config;
    kvs_config = super_handle->kvs_config;
    log_callback = super_handle->log_callback;

    if (super_handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&super_handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on the read-only DB file '%s'.",
                       super_handle->file->filename);
    }

    filemgr_mutex_lock(super_handle->file);
    filemgr_set_rollback(super_handle->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(super_handle->file)) {
        filemgr_set_rollback(super_handle->file, 0);
        filemgr_mutex_unlock(super_handle->file);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(super_handle->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(super_handle->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(super_handle->file);
        fstatus = filemgr_get_file_status(super_handle->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(super_handle->file);
        fdb_check_file_reopen(super_handle, NULL);
    } else {
        filemgr_mutex_unlock(super_handle->file);
    }

    fdb_sync_db_header(super_handle);
    // Shutdown WAL discarding entries from all KV Stores..
    fs = wal_shutdown(super_handle->file, &super_handle->log_callback);
    if (fs != FDB_RESULT_SUCCESS) {
        return fs;
    }

    memset(handle, 0, sizeof(fdb_kvs_handle));
    memset(&shandle, 0, sizeof(struct snap_handle));
    handle->log_callback = log_callback;
    handle->fhandle = fhandle;
    // Fast rewind on open...
    atomic_store_uint64_t(&handle->last_hdr_bid, (bid_t)marker);
    handle->max_seqnum = FDB_SNAPSHOT_INMEM; // Prevent WAL restore on open
    handle->shandle = &shandle; // a dummy handle to prevent WAL restore
    if (kvs) {
        fdb_kvs_header_free(file); // KV header will be recreated below.
        handle->kvs = kvs; // re-use super_handle's kvs info
        handle->kvs_config = kvs_config;
    }
    handle->config = config;

    fs = _fdb_open(handle, file->filename, FDB_AFILENAME, &config);

    if (handle->config.multi_kv_instances) {
        filemgr_mutex_lock(handle->file);
        fdb_kvs_header_create(handle->file);
        fdb_kvs_header_read(handle->file->kv_header, handle->dhandle,
                            handle->kv_info_offset,
                            handle->file->version, false);
        filemgr_mutex_unlock(handle->file);
    }

    filemgr_set_rollback(file, 0); // allow mutations
    handle->shandle = NULL; // just a dummy handle never allocated

    if (fs == FDB_RESULT_SUCCESS) {
        fdb_seqnum_t old_seqnum;
        // Restore WAL for all KV instances...
        _fdb_restore_wal(handle, FDB_RESTORE_NORMAL, (bid_t)marker, 0);

        // rollback the file's sequence number
        filemgr_mutex_lock(file);
        old_seqnum = filemgr_get_seqnum(file);
        filemgr_set_seqnum(file, handle->seqnum);
        filemgr_mutex_unlock(file);

        fs = _fdb_commit(handle, FDB_COMMIT_NORMAL,
                         !(handle->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            _fdb_close(super_handle);
            *super_handle = *handle;
        } else {
            filemgr_mutex_lock(file);
            filemgr_set_seqnum(file, old_seqnum);
            filemgr_mutex_unlock(file);
        }
    } else { // Rollback failed, restore KV header
        fdb_kvs_header_create(file);
        fdb_kvs_header_read(file->kv_header, super_handle->dhandle,
                            super_handle->kv_info_offset,
                            ver_get_latest_magic(),
                            false);
    }

    return fs;
}